

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter.cc
# Opt level: O0

Info * re2::Prefilter::Info::Alt(Info *a,Info *b)

{
  Info *pIVar1;
  size_type sVar2;
  size_type sVar3;
  Prefilter *pPVar4;
  Info *in_RSI;
  Info *in_RDI;
  Info *ab;
  Prefilter *in_stack_ffffffffffffff98;
  Info *in_stack_ffffffffffffffa0;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa8;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  Info *local_10;
  Info *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  pIVar1 = (Info *)operator_new(0x40);
  Info(in_stack_ffffffffffffffa0);
  if (((local_8->is_exact_ & 1U) == 0) || ((local_10->is_exact_ & 1U) == 0)) {
    TakeMatch(in_stack_ffffffffffffffa0);
    TakeMatch(in_stack_ffffffffffffffa0);
    pPVar4 = Or((Prefilter *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    pIVar1->match_ = pPVar4;
    pIVar1->is_exact_ = false;
  }
  else {
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter::LengthThenLex,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter::LengthThenLex,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x16066c);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter::LengthThenLex,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter::LengthThenLex,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x16067b);
    if (sVar2 < sVar3) {
      std::swap<re2::Prefilter::Info*>(&local_8,&local_10);
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter::LengthThenLex,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&in_stack_ffffffffffffffa0->exact_,
                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter::LengthThenLex,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff98);
    __first._M_node = (_Base_ptr)pIVar1;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter::LengthThenLex,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter::LengthThenLex,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffff98);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter::LengthThenLex,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter::LengthThenLex,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_ffffffffffffff98);
    std::
    set<std::__cxx11::string,re2::Prefilter::LengthThenLex,std::allocator<std::__cxx11::string>>::
    insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              (&in_stack_ffffffffffffffa0->exact_,__first,in_stack_ffffffffffffffa8);
    pIVar1->is_exact_ = true;
  }
  if (local_8 != (Info *)0x0) {
    ~Info(local_8);
    operator_delete(local_8);
  }
  if (local_10 != (Info *)0x0) {
    ~Info(local_8);
    operator_delete(local_10);
  }
  return pIVar1;
}

Assistant:

Prefilter::Info* Prefilter::Info::Alt(Info* a, Info* b) {
  Info *ab = new Info();

  if (a->is_exact_ && b->is_exact_) {
    // Avoid string copies by moving the larger exact_ set into
    // ab directly, then merge in the smaller set.
    if (a->exact_.size() < b->exact_.size()) {
      using std::swap;
      swap(a, b);
    }
    ab->exact_ = std::move(a->exact_);
    ab->exact_.insert(b->exact_.begin(), b->exact_.end());
    ab->is_exact_ = true;
  } else {
    // Either a or b has is_exact_ = false. If the other
    // one has is_exact_ = true, we move it to match_ and
    // then create a OR of a,b. The resulting Info has
    // is_exact_ = false.
    ab->match_ = Prefilter::Or(a->TakeMatch(), b->TakeMatch());
    ab->is_exact_ = false;
  }

  delete a;
  delete b;
  return ab;
}